

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::
     generateBufferVariableTopLevelCases<(deqp::gles31::Functional::ProgramResourcePropFlags)32768>
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Node *pNVar2;
  Node *pNVar3;
  SharedPtrStateBase *pSVar4;
  deInt32 *pdVar5;
  SharedPtr unsized;
  string local_48;
  
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,0x96985f);
  generateBufferBackedVariableAggregateTypeCases
            (context,parentStructure,targetGroup,PROGRAMINTERFACE_BUFFER_VARIABLE,
             PROGRAMRESOURCEPROP_TOP_LEVEL_ARRAY_SIZE,TYPE_FLOAT_VEC4,&local_48,3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pNVar3 = (Node *)operator_new(0x28);
  pNVar2 = parentStructure->m_ptr;
  pSVar4 = parentStructure->m_state;
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
  pNVar3->m_type = TYPE_ARRAY_ELEMENT;
  (pNVar3->m_enclosingNode).m_ptr = pNVar2;
  (pNVar3->m_enclosingNode).m_state = pSVar4;
  if (pSVar4 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar5 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar5 = *pdVar5 + 1;
    UNLOCK();
  }
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b34c48;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 0xfffffffe;
  unsized.m_state = (SharedPtrStateBase *)0x0;
  unsized.m_ptr = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  unsized.m_state = pSVar4;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"_unsized_array","");
  generateBufferBackedVariableAggregateTypeCases
            (context,&unsized,targetGroup,PROGRAMINTERFACE_BUFFER_VARIABLE,
             PROGRAMRESOURCEPROP_TOP_LEVEL_ARRAY_SIZE,TYPE_FLOAT_VEC4,&local_48,2);
  pdVar5 = &pSVar4->strongRefCount;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pSVar4 = unsized.m_state;
  LOCK();
  *pdVar5 = *pdVar5 + -1;
  UNLOCK();
  if (*pdVar5 == 0) {
    unsized.m_ptr = (Node *)0x0;
    (*(unsized.m_state)->_vptr_SharedPtrStateBase[2])(unsized.m_state);
  }
  LOCK();
  pdVar5 = &pSVar4->weakRefCount;
  *pdVar5 = *pdVar5 + -1;
  UNLOCK();
  if ((*pdVar5 == 0) && (unsized.m_state != (SharedPtrStateBase *)0x0)) {
    (*(unsized.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  return;
}

Assistant:

static void generateBufferVariableTopLevelCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup)
{
	// basic and aggregate types
	generateBufferBackedVariableAggregateTypeCases(context, parentStructure, targetGroup, PROGRAMINTERFACE_BUFFER_VARIABLE, TargetProp, glu::TYPE_FLOAT_VEC4, "", 3);

	// basic and aggregate types in an unsized array
	{
		const ResourceDefinition::Node::SharedPtr unsized(new ResourceDefinition::ArrayElement(parentStructure, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));

		generateBufferBackedVariableAggregateTypeCases(context, unsized, targetGroup, PROGRAMINTERFACE_BUFFER_VARIABLE, TargetProp, glu::TYPE_FLOAT_VEC4, "_unsized_array", 2);
	}
}